

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O3

void VP8LOptimizeSampling
               (uint32_t *image,int full_width,int full_height,int bits,int max_bits,
               int *best_bits_out)

{
  long lVar1;
  uint32_t *puVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  uint32_t *puVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  uint32_t *puVar22;
  
  bVar7 = (byte)bits;
  iVar3 = 1 << (bVar7 & 0x1f);
  uVar12 = (iVar3 + full_width) - 1U >> (bVar7 & 0x1f);
  uVar13 = (iVar3 + full_height) - 1U >> (bVar7 & 0x1f);
  *best_bits_out = bits;
  if (bits < max_bits) {
    lVar6 = (long)(int)uVar12;
    __n = lVar6 * 4;
    iVar3 = bits;
    do {
      iVar8 = iVar3 + 1;
      iVar4 = 1 << ((char)iVar3 - bVar7 & 0x1f);
      if (iVar4 < (int)uVar13) {
        lVar18 = (long)(1 << ((char)iVar8 - bVar7 & 0x1f));
        lVar19 = 0;
        puVar22 = image;
        do {
          iVar5 = bcmp(puVar22,(uint32_t *)((long)puVar22 + (long)iVar4 * __n),__n);
          iVar21 = iVar3;
          if (iVar5 != 0) goto LAB_00178fef;
          lVar19 = lVar19 + lVar18;
          puVar22 = (uint32_t *)((long)puVar22 + __n * lVar18);
        } while (lVar19 < (long)(int)uVar13 - (long)iVar4);
      }
      iVar3 = iVar8;
      iVar21 = max_bits;
    } while (iVar8 != max_bits);
LAB_00178fef:
    if (iVar21 != bits) {
      iVar3 = bits;
      if (iVar21 < bits) {
        iVar3 = iVar21;
      }
      if (bits < iVar21 && 0 < (int)uVar13) {
LAB_00179027:
        lVar18 = (long)(1 << ((char)iVar21 - bVar7 & 0x1f));
        lVar19 = 0;
        puVar22 = image;
        do {
          if (0 < (int)uVar12) {
            puVar10 = puVar22;
            lVar15 = 0;
            do {
              lVar1 = lVar15 + lVar18;
              uVar16 = uVar12;
              if ((int)(uint)lVar1 < (int)uVar12) {
                uVar16 = (uint)lVar1;
              }
              lVar20 = 1;
              while (lVar15 + lVar20 < (long)(int)uVar16) {
                puVar2 = puVar10 + lVar20;
                lVar20 = lVar20 + 1;
                if (*puVar2 != image[lVar19 * lVar6 + lVar15]) {
                  iVar4 = iVar21 + -1;
                  if ((bits < iVar4) && (iVar21 = iVar4, 0 < (int)uVar13)) goto LAB_00179027;
                  iVar21 = iVar3;
                  if (bits < iVar4) {
                    iVar21 = iVar4;
                  }
                  goto LAB_001790f9;
                }
              }
            } while (((long)(int)uVar16 <= lVar15 + lVar20) &&
                    (puVar10 = puVar10 + lVar18, lVar15 = lVar1, lVar1 < lVar6));
          }
          lVar19 = lVar19 + 1;
          puVar22 = puVar22 + lVar6;
        } while (lVar19 < (int)uVar13);
      }
LAB_001790f9:
      if (iVar21 - bits != 0) {
        bVar7 = (byte)iVar21;
        iVar3 = 1 << (bVar7 & 0x1f);
        uVar16 = full_width + -1 + iVar3;
        uVar17 = uVar16 >> (bVar7 & 0x1f);
        uVar13 = iVar3 + full_height + -1;
        if (0 < (int)(uVar13 >> (bVar7 & 0x1f))) {
          iVar3 = 0;
          uVar11 = 0;
          uVar14 = 0;
          do {
            if (0 < (int)(uVar16 >> (bVar7 & 0x1f))) {
              uVar9 = 0;
              do {
                image[uVar11 + uVar9] = image[iVar3 + (int)uVar9 << ((byte)(iVar21 - bits) & 0x1f)];
                uVar9 = uVar9 + 1;
              } while (uVar17 != uVar9);
            }
            uVar14 = uVar14 + 1;
            uVar11 = (ulong)((int)uVar11 + uVar17);
            iVar3 = iVar3 + uVar12;
          } while (uVar14 != uVar13 >> (bVar7 & 0x1f));
        }
        *best_bits_out = iVar21;
      }
    }
  }
  return;
}

Assistant:

void VP8LOptimizeSampling(uint32_t* const image, int full_width,
                          int full_height, int bits, int max_bits,
                          int* best_bits_out) {
  int width = VP8LSubSampleSize(full_width, bits);
  int height = VP8LSubSampleSize(full_height, bits);
  int old_width, x, y, square_size;
  int best_bits = bits;
  *best_bits_out = bits;
  // Check rows first.
  while (best_bits < max_bits) {
    const int new_square_size = 1 << (best_bits + 1 - bits);
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; y + square_size < height; y += new_square_size) {
      // Check the first lines of consecutive line groups.
      if (memcmp(&image[y * width], &image[(y + square_size) * width],
                 width * sizeof(*image)) != 0) {
        is_good = 0;
        break;
      }
    }
    if (is_good) {
      ++best_bits;
    } else {
      break;
    }
  }
  if (best_bits == bits) return;

  // Check columns.
  while (best_bits > bits) {
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; is_good && y < height; ++y) {
      for (x = 0; is_good && x < width; x += square_size) {
        int i;
        for (i = x + 1; i < GetMin(x + square_size, width); ++i) {
          if (image[y * width + i] != image[y * width + x]) {
            is_good = 0;
            break;
          }
        }
      }
    }
    if (is_good) {
      break;
    }
    --best_bits;
  }
  if (best_bits == bits) return;

  // Subsample the image.
  old_width = width;
  square_size = 1 << (best_bits - bits);
  width = VP8LSubSampleSize(full_width, best_bits);
  height = VP8LSubSampleSize(full_height, best_bits);
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      image[y * width + x] = image[square_size * (y * old_width + x)];
    }
  }
  *best_bits_out = best_bits;
}